

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O3

bool __thiscall
cmFortranParser_s::FindIncludeFile
          (cmFortranParser_s *this,char *dir,char *includeName,string *fileName)

{
  char *pcVar1;
  pointer pbVar2;
  bool bVar3;
  pointer pbVar4;
  string fullName;
  allocator<char> local_51;
  string local_50;
  
  bVar3 = cmsys::SystemTools::FileIsFullPath(includeName);
  if (bVar3) {
    pcVar1 = (char *)fileName->_M_string_length;
    strlen(includeName);
    std::__cxx11::string::_M_replace((ulong)fileName,0,pcVar1,(ulong)includeName);
    bVar3 = cmsys::SystemTools::FileExists(fileName,true);
    return bVar3;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,dir,&local_51);
  std::__cxx11::string::append((char *)&local_50);
  std::__cxx11::string::append((char *)&local_50);
  bVar3 = cmsys::SystemTools::FileExists(&local_50,true);
  if (bVar3) {
    bVar3 = true;
    std::__cxx11::string::_M_assign((string *)fileName);
  }
  else {
    pbVar4 = (this->IncludePath).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->IncludePath).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar4 != pbVar2) {
      do {
        std::__cxx11::string::_M_assign((string *)&local_50);
        std::__cxx11::string::append((char *)&local_50);
        std::__cxx11::string::append((char *)&local_50);
        bVar3 = cmsys::SystemTools::FileExists(&local_50,true);
        if (bVar3) {
          bVar3 = true;
          std::__cxx11::string::_M_assign((string *)fileName);
          goto LAB_00378938;
        }
        pbVar4 = pbVar4 + 1;
      } while (pbVar4 != pbVar2);
    }
    bVar3 = false;
  }
LAB_00378938:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmFortranParser_s::FindIncludeFile(const char* dir,
                                        const char* includeName,
                                        std::string& fileName)
{
  // If the file is a full path, include it directly.
  if (cmSystemTools::FileIsFullPath(includeName)) {
    fileName = includeName;
    return cmSystemTools::FileExists(fileName, true);
  }
  // Check for the file in the directory containing the including
  // file.
  std::string fullName = dir;
  fullName += "/";
  fullName += includeName;
  if (cmSystemTools::FileExists(fullName, true)) {
    fileName = fullName;
    return true;
  }

  // Search the include path for the file.
  for (std::string const& i : this->IncludePath) {
    fullName = i;
    fullName += "/";
    fullName += includeName;
    if (cmSystemTools::FileExists(fullName, true)) {
      fileName = fullName;
      return true;
    }
  }
  return false;
}